

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O0

iterator llvm::yaml::begin<llvm::yaml::SequenceNode>(SequenceNode *C)

{
  SequenceNode *C_local;
  iterator ret;
  
  if ((C->IsAtBeginning & 1U) == 0) {
    __assert_fail("C.IsAtBeginning && \"You may only iterate over a collection once!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/YAMLParser.h"
                  ,0x17d,
                  "typename CollectionType::iterator llvm::yaml::begin(CollectionType &) [CollectionType = llvm::yaml::SequenceNode]"
                 );
  }
  C->IsAtBeginning = false;
  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::basic_collection_iterator
            ((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *)&C_local,C);
  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++
            ((basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> *)&C_local);
  return (iterator)C_local;
}

Assistant:

typename CollectionType::iterator begin(CollectionType &C) {
  assert(C.IsAtBeginning && "You may only iterate over a collection once!");
  C.IsAtBeginning = false;
  typename CollectionType::iterator ret(&C);
  ++ret;
  return ret;
}